

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CDict *
ZSTD_createCDict_advanced
          (void *dictBuffer,size_t dictSize,ZSTD_dictLoadMethod_e dictLoadMethod,
          ZSTD_dictContentType_e dictContentType,ZSTD_compressionParameters cParams,
          ZSTD_customMem customMem)

{
  ZSTD_customMem customMem_00;
  ZSTD_customMem customMem_01;
  ZSTD_customMem customMem_02;
  ZSTD_customMem customMem_03;
  uint uVar1;
  size_t sVar2;
  ZSTD_CDict *cdict_00;
  size_t in_stack_00000028;
  void *workspace;
  size_t workspaceSize;
  ZSTD_CDict *cdict;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  size_t *psVar3;
  ZSTD_compressionParameters *cParams_00;
  ZSTD_CDict *local_8;
  
  psVar3 = &stack0x00000028;
  cParams_00 = (ZSTD_compressionParameters *)&stack0x00000008;
  if ((in_stack_00000028 == 0) == (workspace == (void *)0x0)) {
    customMem_00.customAlloc._4_4_ = in_stack_ffffffffffffffb4;
    customMem_00.customAlloc._0_4_ = in_stack_ffffffffffffffb0;
    customMem_00.customFree = (ZSTD_freeFunction)psVar3;
    customMem_00.opaque = cParams_00;
    local_8 = (ZSTD_CDict *)ZSTD_malloc(in_stack_00000028,customMem_00);
    sVar2 = ZSTD_sizeof_matchState(cParams_00,0);
    customMem_01.customAlloc._4_4_ = in_stack_ffffffffffffffb4;
    customMem_01.customAlloc._0_4_ = in_stack_ffffffffffffffb0;
    customMem_01.customFree = (ZSTD_freeFunction)psVar3;
    customMem_01.opaque = cParams_00;
    cdict_00 = (ZSTD_CDict *)ZSTD_malloc(*psVar3,customMem_01);
    if ((local_8 == (ZSTD_CDict *)0x0) || (cdict_00 == (ZSTD_CDict *)0x0)) {
      customMem_02.customAlloc._4_4_ = in_stack_ffffffffffffffb4;
      customMem_02.customAlloc._0_4_ = in_stack_ffffffffffffffb0;
      customMem_02.customFree = (ZSTD_freeFunction)psVar3;
      customMem_02.opaque = cParams_00;
      ZSTD_free((void *)psVar3[1],customMem_02);
      customMem_03.customAlloc._4_4_ = in_stack_ffffffffffffffb4;
      customMem_03.customAlloc._0_4_ = in_stack_ffffffffffffffb0;
      customMem_03.customFree = (ZSTD_freeFunction)psVar3;
      customMem_03.opaque = cParams_00;
      ZSTD_free((void *)psVar3[1],customMem_03);
      local_8 = (ZSTD_CDict *)0x0;
    }
    else {
      (local_8->customMem).customAlloc = (ZSTD_allocFunction)*psVar3;
      (local_8->customMem).customFree = (ZSTD_freeFunction)psVar3[1];
      (local_8->customMem).opaque = (void *)psVar3[2];
      local_8->workspace = cdict_00;
      local_8->workspaceSize = sVar2 + 0x1800;
      ZSTD_initCDict_internal
                ((ZSTD_CDict *)dictBuffer,(void *)dictSize,CONCAT44(dictLoadMethod,dictContentType),
                 cdict._4_4_,(ZSTD_dictContentType_e)cdict,cParams);
      uVar1 = ZSTD_isError(0x1f2536);
      if (uVar1 != 0) {
        ZSTD_freeCDict(cdict_00);
        local_8 = (ZSTD_CDict *)0x0;
      }
    }
  }
  else {
    local_8 = (ZSTD_CDict *)0x0;
  }
  return local_8;
}

Assistant:

ZSTD_CDict* ZSTD_createCDict_advanced(const void* dictBuffer, size_t dictSize,
                                      ZSTD_dictLoadMethod_e dictLoadMethod,
                                      ZSTD_dictContentType_e dictContentType,
                                      ZSTD_compressionParameters cParams, ZSTD_customMem customMem)
{
    DEBUGLOG(3, "ZSTD_createCDict_advanced, mode %u", (U32)dictContentType);
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;

    {   ZSTD_CDict* const cdict = (ZSTD_CDict*)ZSTD_malloc(sizeof(ZSTD_CDict), customMem);
        size_t const workspaceSize = HUF_WORKSPACE_SIZE + ZSTD_sizeof_matchState(&cParams, /* forCCtx */ 0);
        void* const workspace = ZSTD_malloc(workspaceSize, customMem);

        if (!cdict || !workspace) {
            ZSTD_free(cdict, customMem);
            ZSTD_free(workspace, customMem);
            return NULL;
        }
        cdict->customMem = customMem;
        cdict->workspace = workspace;
        cdict->workspaceSize = workspaceSize;
        if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                        dictBuffer, dictSize,
                                        dictLoadMethod, dictContentType,
                                        cParams) )) {
            ZSTD_freeCDict(cdict);
            return NULL;
        }

        return cdict;
    }
}